

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  pointer pCVar1;
  int in_EAX;
  size_t sVar2;
  ostream *poVar3;
  ColumnInfo *info;
  pointer pCVar4;
  
  if (this->m_isOpen != false) {
    return in_EAX;
  }
  this->m_isOpen = true;
  if (0 < this->m_currentColumn) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->m_os,"\n",1);
    this->m_currentColumn = -1;
  }
  pCVar4 = (this->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar4 != pCVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->m_oss,(pCVar4->name)._M_dataplus._M_p,
                 (pCVar4->name)._M_string_length);
      operator<<(this);
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar1);
  }
  if (0 < this->m_currentColumn) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->m_os,"\n",1);
    this->m_currentColumn = -1;
  }
  poVar3 = (ostream *)this->m_os;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a3d70 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a3d77._0_1_ = '-';
    uRam00000000001a3d77._1_1_ = '-';
    uRam00000000001a3d77._2_1_ = '-';
    uRam00000000001a3d77._3_1_ = '-';
    uRam00000000001a3d77._4_1_ = '-';
    uRam00000000001a3d77._5_1_ = '-';
    uRam00000000001a3d77._6_1_ = '-';
    uRam00000000001a3d77._7_1_ = '-';
    DAT_001a3d60 = '-';
    DAT_001a3d60_1._0_1_ = '-';
    DAT_001a3d60_1._1_1_ = '-';
    DAT_001a3d60_1._2_1_ = '-';
    DAT_001a3d60_1._3_1_ = '-';
    DAT_001a3d60_1._4_1_ = '-';
    DAT_001a3d60_1._5_1_ = '-';
    DAT_001a3d60_1._6_1_ = '-';
    uRam00000000001a3d68 = 0x2d2d2d2d2d2d2d;
    DAT_001a3d6f = 0x2d;
    DAT_001a3d50 = '-';
    DAT_001a3d50_1._0_1_ = '-';
    DAT_001a3d50_1._1_1_ = '-';
    DAT_001a3d50_1._2_1_ = '-';
    DAT_001a3d50_1._3_1_ = '-';
    DAT_001a3d50_1._4_1_ = '-';
    DAT_001a3d50_1._5_1_ = '-';
    DAT_001a3d50_1._6_1_ = '-';
    uRam00000000001a3d58._0_1_ = '-';
    uRam00000000001a3d58._1_1_ = '-';
    uRam00000000001a3d58._2_1_ = '-';
    uRam00000000001a3d58._3_1_ = '-';
    uRam00000000001a3d58._4_1_ = '-';
    uRam00000000001a3d58._5_1_ = '-';
    uRam00000000001a3d58._6_1_ = '-';
    uRam00000000001a3d58._7_1_ = '-';
    DAT_001a3d40 = '-';
    DAT_001a3d40_1._0_1_ = '-';
    DAT_001a3d40_1._1_1_ = '-';
    DAT_001a3d40_1._2_1_ = '-';
    DAT_001a3d40_1._3_1_ = '-';
    DAT_001a3d40_1._4_1_ = '-';
    DAT_001a3d40_1._5_1_ = '-';
    DAT_001a3d40_1._6_1_ = '-';
    uRam00000000001a3d48._0_1_ = '-';
    uRam00000000001a3d48._1_1_ = '-';
    uRam00000000001a3d48._2_1_ = '-';
    uRam00000000001a3d48._3_1_ = '-';
    uRam00000000001a3d48._4_1_ = '-';
    uRam00000000001a3d48._5_1_ = '-';
    uRam00000000001a3d48._6_1_ = '-';
    uRam00000000001a3d48._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a3d38._0_1_ = '-';
    uRam00000000001a3d38._1_1_ = '-';
    uRam00000000001a3d38._2_1_ = '-';
    uRam00000000001a3d38._3_1_ = '-';
    uRam00000000001a3d38._4_1_ = '-';
    uRam00000000001a3d38._5_1_ = '-';
    uRam00000000001a3d38._6_1_ = '-';
    uRam00000000001a3d38._7_1_ = '-';
    DAT_001a3d7f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return (int)poVar3;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();
            for (auto const& info : m_columnInfos)
                *this << info.name << ColumnBreak();
            *this << RowBreak();
            m_os << Catch::getLineOfChars<'-'>() << "\n";
        }
    }